

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::release
          (Fasttrack<std::shared_mutex> *this,tls_t tls,void *mutex,bool write)

{
  void *other;
  bool bVar1;
  pointer prVar2;
  iterator iVar3;
  ThreadState *thr;
  iterator local_60 [2];
  undefined1 local_40 [8];
  iterator it;
  lock_guard<std::shared_mutex> exLockT;
  void *pvStack_20;
  bool write_local;
  void *mutex_local;
  tls_t tls_local;
  Fasttrack<std::shared_mutex> *this_local;
  
  pvStack_20 = mutex;
  mutex_local = tls;
  tls_local = this;
  std::lock_guard<std::shared_mutex>::lock_guard
            ((lock_guard<std::shared_mutex> *)&it.field_1,&this->g_lock);
  iVar3 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
          ::find<void*>((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
                         *)&this->locks,&stack0xffffffffffffffe0);
  it.ctrl_ = (ctrl_t *)iVar3.field_1;
  local_40 = (undefined1  [8])iVar3.ctrl_;
  local_60[0] = phmap::container_internal::
                raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                ::end((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                       *)&this->locks);
  bVar1 = phmap::container_internal::operator==((iterator *)local_40,local_60);
  other = mutex_local;
  if (bVar1) {
    createLock(this,pvStack_20);
  }
  else {
    ThreadState::inc_vc((ThreadState *)mutex_local);
    prVar2 = phmap::container_internal::
             raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
             ::iterator::operator->((iterator *)local_40);
    VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::update
              (&prVar2->second,
               (VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *)other
              );
  }
  std::lock_guard<std::shared_mutex>::~lock_guard((lock_guard<std::shared_mutex> *)&it.field_1);
  return;
}

Assistant:

void release(tls_t tls, void* mutex, bool write) final {
    std::lock_guard<LockT> exLockT(g_lock);
    auto it = locks.find(mutex);
    if (it == locks.end()) {
#if MAKE_OUTPUT
      std::cerr << "lock is released but was never acquired by any thread"
                << std::endl;
#endif
      createLock(mutex);
      return;  // as lock is empty (was never acquired), we can return here
    }

    ThreadState* thr = reinterpret_cast<ThreadState*>(tls);
    thr->inc_vc();

    // increase vector clock and propagate to lock
    it->second.update(thr);
  }